

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O1

void sys_setalarm(int microsec)

{
  sig_t in_RSI;
  int signo;
  itimerval local_28;
  
  local_28.it_value.tv_sec = (__time_t)(microsec / 1000000);
  local_28.it_interval.tv_sec = 0;
  local_28.it_interval.tv_usec = 0;
  local_28.it_value.tv_usec = (__suseconds_t)(microsec % 1000000);
  signo = 1;
  if (microsec % 1000000 != 0) {
    signo = 0x115ba6;
  }
  sys_signal(signo,in_RSI);
  setitimer(ITIMER_REAL,&local_28,(itimerval *)0x0);
  return;
}

Assistant:

void sys_setalarm(int microsec)
{
    struct itimerval gonzo;
    int sec = (int)(microsec/1000000);
    microsec %= 1000000;
#if 0
    fprintf(stderr, "timer %d:%d\n", sec, microsec);
#endif
    gonzo.it_interval.tv_sec = 0;
    gonzo.it_interval.tv_usec = 0;
    gonzo.it_value.tv_sec = sec;
    gonzo.it_value.tv_usec = microsec;
    if (microsec)
        sys_signal(SIGALRM, sys_alarmhandler);
    else sys_signal(SIGALRM, SIG_IGN);
    setitimer(ITIMER_REAL, &gonzo, 0);
}